

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readArray(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  byte *pbVar4;
  int iVar5;
  int index;
  Token endArray;
  Value init;
  Token token;
  undefined1 local_90 [32];
  Value local_70;
  Token local_48;
  
  Value::Value(&local_70,arrayValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&local_70);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)tokenStart->start_ - (long)this->begin_);
  pbVar4 = (byte *)this->current_;
  while (((pbVar4 != (byte *)this->end_ && ((ulong)*pbVar4 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
    pbVar4 = pbVar4 + 1;
    this->current_ = (Location)pbVar4;
  }
  if (*this->current_ == ']') {
    readToken(this,(Token *)local_90);
  }
  else {
    index = 0;
    do {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_90._0_8_ = Value::operator[](ppVVar3[-1],index);
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                  ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
      }
      else {
        *ppVVar3 = (Value *)local_90._0_8_;
        piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar2 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (bVar2) {
        readToken(this,&local_48);
        while (local_48.type_ == tokenComment) {
          readToken(this,&local_48);
        }
        if (local_48.type_ == tokenArrayEnd) {
          iVar5 = 2;
        }
        else if (local_48.type_ == tokenArraySeparator) {
          iVar5 = 0;
        }
        else {
          local_90._0_8_ = local_90 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
          addError(this,(string *)local_90,&local_48,(Location)0x0);
          recoverFromError(this,tokenArrayEnd);
          if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_);
          }
          iVar5 = 1;
        }
      }
      else {
        iVar5 = 1;
        recoverFromError(this,tokenArrayEnd);
      }
      index = index + 1;
    } while (iVar5 == 0);
    if (iVar5 != 2) {
      bVar2 = false;
      goto LAB_0011bd06;
    }
  }
  bVar2 = true;
LAB_0011bd06:
  Value::~Value(&local_70);
  return bVar2;
}

Assistant:

bool Reader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}